

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O2

void ncnn::conv3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  int iVar14;
  void *pvVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  float *pfVar23;
  ulong uVar24;
  float _v;
  Mat out;
  Mat local_b0;
  Mat local_70;
  
  iVar5 = bottom_blob->w;
  uVar6 = bottom_blob->c;
  iVar7 = top_blob->w;
  pvVar8 = _kernel->data;
  pvVar9 = _bias->data;
  uVar24 = 0;
  iVar14 = top_blob->h;
  if (top_blob->h < 1) {
    iVar14 = 0;
  }
  uVar18 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar18 = uVar24;
  }
  uVar17 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar17 = uVar24;
  }
  lVar22 = (long)((iVar5 - iVar7) * 2) * 4;
  for (; uVar24 != uVar17; uVar24 = uVar24 + 1) {
    Mat::channel(&local_b0,top_blob,(int)uVar24);
    if (pvVar9 == (void *)0x0) {
      _v = 0.0;
    }
    else {
      _v = *(float *)((long)pvVar9 + uVar24 * 4);
    }
    Mat::fill(&local_b0,_v);
    iVar10 = uVar6 * 9 * (int)uVar24;
    for (uVar13 = 0; pfVar23 = (float *)local_b0.data, uVar13 != uVar18; uVar13 = uVar13 + 1) {
      Mat::channel(&local_70,bottom_blob,(int)uVar13);
      pvVar15 = local_70.data;
      Mat::~Mat(&local_70);
      lVar11 = uVar13 * 0x24;
      pvVar12 = (void *)((long)iVar5 * 4 + (long)pvVar15);
      pvVar21 = (void *)((long)iVar5 * 8 + (long)pvVar15);
      for (iVar16 = 0; iVar16 != iVar14; iVar16 = iVar16 + 1) {
        lVar19 = 0;
        for (iVar20 = iVar7; 0 < iVar20; iVar20 = iVar20 + -1) {
          uVar3 = *(undefined8 *)((long)pvVar15 + lVar19 + 4);
          pfVar1 = (float *)((long)pvVar8 + lVar11 + (long)iVar10 * 4);
          pfVar2 = (float *)((long)pvVar8 + lVar11 + (long)iVar10 * 4 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar12 + lVar19 + 4);
          *pfVar23 = (float)((ulong)*(undefined8 *)((long)pvVar21 + lVar19) >> 0x20) * pfVar2[3] +
                     *(float *)((long)pvVar12 + lVar19) * pfVar1[3] +
                     (float)((ulong)uVar4 >> 0x20) * pfVar2[1] + (float)uVar3 * pfVar1[1] +
                     (float)*(undefined8 *)((long)pvVar21 + lVar19) * pfVar2[2] +
                     (float)((ulong)uVar3 >> 0x20) * pfVar1[2] +
                     (float)uVar4 * *pfVar2 + *(float *)((long)pvVar15 + lVar19) * *pfVar1 +
                     *(float *)((long)pvVar8 + lVar11 + (long)iVar10 * 4 + 0x20) *
                     *(float *)((long)pvVar21 + lVar19 + 8) + *pfVar23;
          pfVar23 = pfVar23 + 1;
          lVar19 = lVar19 + 8;
        }
        pvVar15 = (void *)((long)pvVar15 + lVar19 + lVar22);
        pvVar12 = (void *)((long)pvVar12 + lVar19 + lVar22);
        pvVar21 = (void *)((long)pvVar21 + lVar19 + lVar22);
      }
    }
    Mat::~Mat(&local_b0);
  }
  return;
}

Assistant:

static void conv3x3s2_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q = 0; q < inch; q++)
        {
            float *outptr = out;

            const float *img = bottom_blob.channel(q);
            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float *r0 = img;
            const float *r1 = img + w;
            const float *r2 = img + w * 2;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }
        }
    }
}